

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsimd.c
# Opt level: O0

void jsimd_idct_islow(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                     JSAMPARRAY output_buf,JDIMENSION output_col)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  long in_RSI;
  undefined4 in_R8D;
  
  if ((simd_support & 0x80) == 0) {
    jsimd_idct_islow_sse2(*(undefined8 *)(in_RSI + 0x58),in_RDX,in_RCX,in_R8D);
  }
  else {
    jsimd_idct_islow_avx2(*(undefined8 *)(in_RSI + 0x58),in_RDX,in_RCX,in_R8D);
  }
  return;
}

Assistant:

GLOBAL(void)
jsimd_idct_islow(j_decompress_ptr cinfo, jpeg_component_info *compptr,
                 JCOEFPTR coef_block, JSAMPARRAY output_buf,
                 JDIMENSION output_col)
{
  if (simd_support & JSIMD_AVX2)
    jsimd_idct_islow_avx2(compptr->dct_table, coef_block, output_buf,
                          output_col);
  else
    jsimd_idct_islow_sse2(compptr->dct_table, coef_block, output_buf,
                          output_col);
}